

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigInteger.cpp
# Opt level: O1

XMLCh * xercesc_4_0::XMLBigInteger::getCanonicalRepresentation
                  (XMLCh *rawData,MemoryManager *memMgr,bool param_3)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  XMLCh *pXVar4;
  undefined7 in_register_00000011;
  long lVar5;
  int sign;
  ArrayJanitor<char16_t> jan;
  int local_2c;
  ArrayJanitor<char16_t> local_28;
  XMLCh *toDelete;
  undefined4 extraout_var_00;
  
  if (rawData == (XMLCh *)0x0) {
    lVar5 = 4;
  }
  else {
    lVar3 = 2;
    do {
      lVar5 = lVar3 + 2;
      lVar1 = lVar3 + -2;
      lVar3 = lVar5;
    } while (*(short *)((long)rawData + lVar1) != 0);
  }
  iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,lVar5,CONCAT71(in_register_00000011,param_3));
  toDelete = (XMLCh *)CONCAT44(extraout_var,iVar2);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_28,toDelete,memMgr);
  local_2c = 0;
  parseBigInteger(rawData,toDelete,&local_2c,XMLPlatformUtils::fgMemoryManager);
  if (local_2c == -1) {
    if (toDelete == (XMLCh *)0x0) {
      lVar5 = 4;
    }
    else {
      lVar3 = 2;
      do {
        lVar5 = lVar3 + 2;
        lVar1 = lVar3 + -2;
        lVar3 = lVar5;
      } while (*(short *)((long)toDelete + lVar1) != 0);
    }
    iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,lVar5);
    pXVar4 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    *pXVar4 = L'-';
    XMLString::copyString(pXVar4 + 1,toDelete);
  }
  else {
    if (local_2c == 0) {
      toDelete[0] = L'0';
      toDelete[1] = L'\0';
    }
    ArrayJanitor<char16_t>::release(&local_28);
    pXVar4 = toDelete;
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_28);
  return pXVar4;
}

Assistant:

XMLCh* XMLBigInteger::getCanonicalRepresentation(const XMLCh*         const rawData
                                               ,       MemoryManager* const memMgr
                                               ,       bool           /*      isNonPositiveInteger */)
{
    try 
    {
        XMLCh* retBuf = (XMLCh*) memMgr->allocate( (XMLString::stringLen(rawData) + 2) * sizeof(XMLCh));
        ArrayJanitor<XMLCh> jan(retBuf, memMgr);
        int    sign = 0;

        XMLBigInteger::parseBigInteger(rawData, retBuf, sign);

        if (sign == 0)
        {
           retBuf[0] = chDigit_0;
           retBuf[1] = chNull;           
        }
        else if (sign == -1)
        {
            XMLCh* retBuffer = (XMLCh*) memMgr->allocate( (XMLString::stringLen(retBuf) + 2) * sizeof(XMLCh));
            retBuffer[0] = chDash;
            XMLString::copyString(&(retBuffer[1]), retBuf);
            return retBuffer;
        }

        jan.release();
        return retBuf;

    }
    catch (const NumberFormatException&)
    {
        return 0;
    }

}